

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O2

void Dar2_LibEvalAssignNums(Gia_Man_t *p,int Class)

{
  Dar_LibObj_t *pDVar1;
  Dar_LibObj_t DVar2;
  Dar_LibDat_t *pDVar3;
  Dar_Lib_t *pDVar4;
  uint iLit;
  uint iLit_00;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *p1;
  uint uVar7;
  ulong uVar9;
  Dar_LibDat_t *pDVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar8;
  
  lVar13 = 0;
  do {
    pDVar4 = s_DarLib;
    if (s_DarLib->nNodes0[Class] <= lVar13) {
      return;
    }
    iVar5 = s_DarLib->pNodes0[Class][lVar13];
    pDVar1 = s_DarLib->pObjs;
    uVar7 = (int)lVar13 + 4U & 0xfffffff;
    uVar8 = (ulong)uVar7;
    pDVar1[iVar5] = (Dar_LibObj_t)((ulong)pDVar1[iVar5] & 0xfffffffff | uVar8 << 0x24);
    if (pDVar4->nNodes0Max + 4 <= (int)uVar7) {
      __assert_fail("(int)pObj->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x44a,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
    }
    pDVar10 = pDVar4->pDatas;
    pDVar10[uVar8].fMffc = '\0';
    pDVar10[uVar8].field_0.iGunc = -1;
    pDVar10[uVar8].TravId = 0xffff;
    DVar2 = pDVar4->pObjs[SUB84(pDVar1[iVar5],0) & 0xffff];
    uVar9 = (ulong)DVar2 >> 0x24;
    uVar7 = pDVar4->nNodes0Max + 4;
    if ((int)uVar7 <= (int)(DVar2._4_4_ >> 4)) {
      __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x451,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
    }
    DVar2 = pDVar4->pObjs[SUB84(pDVar1[iVar5],0) >> 0x10];
    uVar12 = (ulong)DVar2 >> 0x24;
    if (uVar7 <= DVar2._4_4_ >> 4) {
      __assert_fail("(int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                    ,0x452,"void Dar2_LibEvalAssignNums(Gia_Man_t *, int)");
    }
    pDVar10 = pDVar10 + uVar8;
    pDVar3 = pDVar4->pDatas;
    iVar11 = pDVar3[uVar12].Level;
    if (pDVar3[uVar12].Level < pDVar3[uVar9].Level) {
      iVar11 = pDVar3[uVar9].Level;
    }
    pDVar10->Level = iVar11 + 1;
    if ((pDVar3[uVar9].field_0.iGunc != -1) && (pDVar3[uVar12].field_0.iGunc != -1)) {
      iLit = Abc_LitNotCond(pDVar3[uVar9].field_0.iGunc,*(uint *)&pDVar1[iVar5].field_0x4 & 1);
      iLit_00 = Abc_LitNotCond(pDVar3[uVar12].field_0.iGunc,SUB84(pDVar1[iVar5],4) >> 1 & 1);
      uVar7 = 0;
      if (((iLit == 0) ||
          (((uVar7 = 0, iLit_00 == 0 || ((iLit_00 ^ iLit) == 1)) || (uVar7 = iLit_00, iLit == 1))))
         || ((iLit == iLit_00 || (uVar7 = iLit, iLit_00 == 1)))) {
        (pDVar10->field_0).iGunc = uVar7;
LAB_00423c97:
        pGVar6 = Gia_ObjFromLit(p,uVar7);
        iVar5 = Gia_ObjLevel(p,(Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe));
        pDVar10->Level = iVar5;
      }
      else {
        pGVar6 = Gia_ObjFromLit(p,iLit);
        p1 = Gia_ObjFromLit(p,iLit_00);
        uVar7 = Gia_ManHashLookup(p,pGVar6,p1);
        if (uVar7 == 0) {
          (pDVar10->field_0).iGunc = -1;
        }
        else {
          (pDVar10->field_0).iGunc = uVar7;
          if (-1 < (int)uVar7) goto LAB_00423c97;
        }
      }
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void Dar2_LibEvalAssignNums( Gia_Man_t * p, int Class )
{
    Dar_LibObj_t * pObj;
    Dar_LibDat_t * pData, * pData0, * pData1;
    int iFanin0, iFanin1, i, iLit;
    for ( i = 0; i < s_DarLib->nNodes0[Class]; i++ )
    {
        // get one class node, assign its temporary number and set its data
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pNodes0[Class][i]);
        pObj->Num = 4 + i;
        assert( (int)pObj->Num < s_DarLib->nNodes0Max + 4 );
        pData = s_DarLib->pDatas + pObj->Num;
        pData->fMffc = 0;
        pData->iGunc = -1;
        pData->TravId = 0xFFFF;

        // explore the fanins
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan0)->Num < s_DarLib->nNodes0Max + 4 );
        assert( (int)Dar_LibObj(s_DarLib, pObj->Fan1)->Num < s_DarLib->nNodes0Max + 4 );
        pData0 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan0)->Num;
        pData1 = s_DarLib->pDatas + Dar_LibObj(s_DarLib, pObj->Fan1)->Num;
        pData->Level = 1 + Abc_MaxInt(pData0->Level, pData1->Level);
        if ( pData0->iGunc == -1 || pData1->iGunc == -1 )
            continue;
        iFanin0 = Abc_LitNotCond( pData0->iGunc, pObj->fCompl0 );
        iFanin1 = Abc_LitNotCond( pData1->iGunc, pObj->fCompl1 );
        // compute the resulting literal
        if ( iFanin0 == 0 || iFanin1 == 0 || iFanin0 == Abc_LitNot(iFanin1) )
            iLit = 0;
        else if ( iFanin0 == 1 || iFanin0 == iFanin1 )
            iLit = iFanin1;
        else if ( iFanin1 == 1 )
            iLit = iFanin0;
        else
        {
            iLit = Gia_ManHashLookup( p, Gia_ObjFromLit(p, iFanin0), Gia_ObjFromLit(p, iFanin1) );
            if ( iLit == 0 )
                iLit = -1;
        }
        pData->iGunc = iLit;
        if ( pData->iGunc >= 0 )
        {
            // update the level to be more accurate
            pData->Level = Gia_ObjLevel( p, Gia_Regular(Gia_ObjFromLit(p, pData->iGunc)) );
            // mark the node if it is part of MFFC
//            pData->fMffc = Gia_ObjIsTravIdCurrentArray(p, Gia_Regular(pData->pGunc));
        }
    }
}